

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

chunk * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  town *ptVar1;
  short sVar2;
  short sVar3;
  loc to_avoid;
  level_map_conflict *plVar4;
  player *ppVar5;
  ulong uVar6;
  _Bool _Var7;
  uint32_t uVar8;
  wchar_t wVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  chunk_conflict *source;
  ulong uVar15;
  chunk *pcVar16;
  char *pcVar17;
  wchar_t *pwVar18;
  square *psVar19;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  loc lVar20;
  loc lVar21;
  feature *pfVar22;
  uint uVar23;
  town *ptVar24;
  loc_conflict lot;
  wchar_t wVar25;
  loc lVar26;
  ulong uVar27;
  loc_conflict lVar28;
  uint32_t uVar29;
  int iVar30;
  wchar_t wVar31;
  uint uVar32;
  loc lVar33;
  chunk *c;
  loc lVar34;
  loc grid;
  loc grid_00;
  loc grid_01;
  level_conflict *plVar35;
  town *ptVar36;
  loc lVar37;
  loc lVar38;
  ulong uVar39;
  town *ptVar40;
  loc lVar41;
  loc lVar42;
  uint uVar43;
  loc lVar44;
  loc lVar45;
  long lVar46;
  wchar_t wVar47;
  int iVar48;
  level_conflict *lev;
  loc lVar49;
  loc lVar50;
  loc grid_02;
  long lVar51;
  bool bVar52;
  bool bVar53;
  loc_conflict door_1;
  loc_conflict door;
  wchar_t lot_south;
  wchar_t lot_e;
  undefined4 uVar54;
  undefined4 in_stack_fffffffffffffea4;
  chunk *pcVar55;
  loc local_150;
  loc local_148;
  loc_conflict local_140;
  ulong local_138;
  loc local_130;
  ulong local_128;
  ulong local_120;
  loc_conflict local_118;
  wchar_t local_110;
  wchar_t local_10c;
  loc local_108;
  loc local_100;
  wchar_t local_f8;
  wchar_t local_f4;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  loc local_d8;
  ulong local_d0;
  loc local_c8;
  ulong local_c0;
  long local_b8;
  player *local_b0;
  loc_conflict local_a8;
  ulong local_a0;
  ulong local_98;
  uint local_8c;
  int local_88;
  wchar_t local_84;
  wchar_t local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  loc local_68;
  undefined8 local_60;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  loc local_38;
  undefined7 extraout_var;
  
  _Var7 = is_daytime();
  local_8c = (uint)(&z_info->town_monsters_day)[!_Var7];
  plVar35 = world->levels + p->place;
  pcVar14 = level_name(plVar35);
  source = chunk_find_name(pcVar14);
  uVar15 = (ulong)world->num_towns;
  bVar52 = 0 < (long)uVar15;
  if ((long)uVar15 < 1) {
    ptVar36 = (town *)0x0;
  }
  else {
    ptVar36 = world->towns;
    if (ptVar36->index != (int)p->place) {
      ptVar24 = ptVar36 + (world->num_towns - 1);
      uVar39 = 1;
      ptVar40 = ptVar36;
      do {
        uVar27 = uVar39;
        ptVar36 = ptVar24;
        if (uVar15 == uVar27) break;
        ptVar36 = ptVar40 + 1;
        ptVar1 = ptVar40 + 1;
        uVar39 = uVar27 + 1;
        ptVar40 = ptVar36;
      } while (ptVar1->index != (int)p->place);
      bVar52 = uVar27 < uVar15;
    }
  }
  if (!bVar52) {
    __assert_fail("i < world->num_towns",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                  ,0xb25,"struct chunk *town_gen(struct player *, int, int, const char **)");
  }
  pcVar16 = (chunk *)cave_new((uint)z_info->town_hgt,
                              (uint)(z_info->town_wid >> (ptVar36->num_stores < 5)));
  lVar49.x = FEAT_MORE;
  local_b0 = p;
  if (source != (chunk_conflict *)0x0) {
    pcVar16->depth = source->depth;
    pcVar16->place = (int)p->place;
    pcVar55 = pcVar16;
    _Var7 = chunk_copy((chunk_conflict *)pcVar16,p,source,L'\0',L'\0',L'\0',false);
    if (!_Var7) {
      quit_fmt("chunk_copy() level bounds failed!");
    }
    chunk_list_remove(pcVar14);
    cave_free(source);
    if ((p->place == p->home) && (_Var7 = find_home(pcVar16,&local_118), !_Var7)) {
      _Var7 = cave_find((chunk_conflict *)pcVar16,&local_140,square_isinemptysquare);
      if (!_Var7) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                      ,0xaf4,"void build_new_house(struct chunk *)");
      }
      wVar25 = local_140.y + L'\xffffffff';
      uVar29 = 8;
      bVar52 = false;
      pcVar16 = pcVar55;
      do {
        local_130.y = L'\0';
        local_130.x = wVar25;
        wVar47 = local_140.x + L'\xfffffffe';
        do {
          wVar47 = wVar47 + L'\x01';
          lVar37.y = wVar25;
          lVar37.x = wVar47;
          lVar28.y = local_140.y;
          lVar28.x = local_140.x;
          _Var7 = loc_eq((loc_conflict)lVar37,lVar28);
          if (_Var7) {
            square_set_feat((chunk_conflict *)pcVar16,lVar37,FEAT_PERM);
          }
          else {
            wVar9 = FEAT_PERM;
            if ((!bVar52) && (uVar8 = Rand_div(uVar29), wVar9 = FEAT_PERM, uVar8 == 0)) {
              wVar9 = lookup_feat("Home");
              bVar52 = true;
            }
            square_set_feat((chunk_conflict *)pcVar16,lVar37,wVar9);
            uVar29 = uVar29 - 1;
          }
        } while (wVar47 <= local_140.x);
        wVar25 = local_130.x + L'\x01';
        p = local_b0;
        pcVar55 = pcVar16;
      } while (local_130.x <= local_140.y);
    }
    c = pcVar16;
    if ((p->place != p->home) && (_Var7 = find_home(pcVar16,&local_140), c = pcVar55, _Var7)) {
      iVar48 = -3;
      wVar25 = local_140.x;
      do {
        wVar47 = wVar25;
        lVar34.y = local_140.y;
        lVar34.x = wVar47;
        _Var7 = square_ispermanent((chunk_conflict *)pcVar55,lVar34);
        iVar48 = iVar48 + 1;
        wVar25 = wVar47 + L'\xffffffff';
      } while (_Var7);
      local_108.y = L'\0';
      local_108.x = local_140.y;
      lVar38.x = wVar47 + L'\x01';
      lVar38.y = L'\0';
      lVar44 = local_108;
      do {
        lVar37 = lVar44;
        _Var7 = square_ispermanent((chunk_conflict *)pcVar55,
                                   (loc)((long)lVar37 << 0x20 | (ulong)lVar38));
        lVar44.x = lVar37.x + L'\xffffffff';
        lVar44.y = L'\0';
        local_100 = lVar38;
      } while (_Var7);
      do {
        wVar25 = local_140.x;
        grid.y = local_140.y;
        grid.x = wVar25;
        _Var7 = square_ispermanent((chunk_conflict *)pcVar55,grid);
        iVar48 = iVar48 + 1;
        local_140.x = wVar25 + L'\x01';
      } while (_Var7);
      lVar33.y = L'\0';
      lVar33.x = wVar25;
      lVar41 = local_108;
      do {
        _Var7 = square_ispermanent((chunk_conflict *)pcVar55,
                                   (loc)((long)lVar41 << 0x20 |
                                        (ulong)(uint)(wVar25 + L'\xffffffff')));
        wVar47 = lVar41.x;
        lVar41.x = wVar47 + L'\x01';
        lVar41.y = L'\0';
      } while (_Var7);
      lVar42.x = wVar47 + L'\xffffffff';
      lVar42.y = L'\0';
      pcVar16 = c;
      if (lVar37.x < lVar42.x) {
        do {
          local_d8 = lVar33;
          local_108 = lVar42;
          local_130.x = lVar37.x + L'\x01';
          local_130.y = L'\0';
          c = pcVar16;
          if (local_100.x < local_d8.x) {
            uVar39 = (long)local_130 << 0x20;
            uVar15 = (ulong)local_100 & 0xffffffff;
            iVar30 = iVar48;
            do {
              square_set_feat((chunk_conflict *)pcVar16,(loc)(uVar15 | uVar39),FEAT_FLOOR);
              uVar15 = (ulong)((int)uVar15 + 1);
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          lVar37 = local_130;
          pcVar16 = c;
          lVar42 = local_108;
          lVar33 = local_d8;
        } while (local_108.x != local_130.x);
      }
    }
    plVar4 = world;
    pcVar14 = strstr(world->name,"Wilderness");
    if (pcVar14 != (char *)0x0) {
      lev = plVar4->levels + local_b0->last_place;
      pcVar14 = plVar35->north;
      if (pcVar14 == (char *)0x0) {
LAB_0014a805:
        pcVar14 = plVar35->east;
        if (pcVar14 != (char *)0x0) {
          pcVar17 = level_name(lev);
          iVar48 = strcmp(pcVar14,pcVar17);
          if (iVar48 == 0) {
            pwVar18 = &FEAT_MORE_EAST;
            goto LAB_0014c004;
          }
        }
        pcVar14 = plVar35->south;
        if (pcVar14 != (char *)0x0) {
          pcVar17 = level_name(lev);
          iVar48 = strcmp(pcVar14,pcVar17);
          if (iVar48 == 0) {
            pwVar18 = &FEAT_MORE_SOUTH;
            goto LAB_0014c004;
          }
        }
        pcVar14 = plVar35->west;
        if (pcVar14 != (char *)0x0) {
          pcVar17 = level_name(lev);
          iVar48 = strcmp(pcVar14,pcVar17);
          if (iVar48 == 0) {
            pwVar18 = &FEAT_MORE_WEST;
            goto LAB_0014c004;
          }
        }
      }
      else {
        pcVar17 = level_name(lev);
        iVar48 = strcmp(pcVar14,pcVar17);
        if (iVar48 != 0) goto LAB_0014a805;
        pwVar18 = &FEAT_MORE_NORTH;
LAB_0014c004:
        lVar49.x = *pwVar18;
      }
      if (lVar49.x == FEAT_MORE) {
        if (plVar35->north == (char *)0x0) {
          if (plVar35->east == (char *)0x0) {
            if (plVar35->south == (char *)0x0) {
              if (plVar35->west == (char *)0x0) goto LAB_0014c04d;
              pwVar18 = &FEAT_MORE_WEST;
            }
            else {
              pwVar18 = &FEAT_MORE_SOUTH;
            }
          }
          else {
            pwVar18 = &FEAT_MORE_EAST;
          }
        }
        else {
          pwVar18 = &FEAT_MORE_NORTH;
        }
        lVar49.x = *pwVar18;
      }
    }
LAB_0014c04d:
    if (c->height < L'\x01') {
      lVar46 = 0;
      uVar15 = 0;
    }
    else {
      lVar51 = 0;
      lVar46 = 0;
      do {
        if (c->width < L'\x01') {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            pfVar22 = square_feat((chunk_conflict *)c,(loc)(lVar51 + uVar15));
            if (pfVar22->fidx == lVar49.x) goto LAB_0014c0a6;
            uVar15 = uVar15 + 1;
          } while ((long)uVar15 < (long)c->width);
        }
        lVar46 = lVar46 + 1;
        lVar51 = lVar51 + 0x100000000;
      } while (lVar46 < c->height);
    }
LAB_0014c0a6:
    lVar28 = (loc_conflict)(uVar15 & 0xffffffff | lVar46 << 0x20);
    goto LAB_0014c0b0;
  }
  pcVar16->depth = (int)p->depth;
  pcVar16->place = (int)p->place;
  c = pcVar16;
  uVar29 = Rand_div(3);
  local_a0 = (ulong)(uint)pcVar16->height;
  local_98 = (ulong)(uint)pcVar16->width;
  lVar49.x = pcVar16->width + L'\xffffffff';
  uVar15 = (ulong)(uint)lVar49.x;
  uVar39 = 0;
  draw_rectangle(pcVar16,L'\0',L'\0',pcVar16->height + L'\xffffffff',lVar49.x,FEAT_PERM,L'\0',true);
  local_38 = (loc)&ptVar36->stores;
  local_88 = uVar29 + 5;
  if (local_88 < 1) {
    local_88 = 0;
  }
  local_88 = local_88 + 1;
  local_68.x = L'\x01';
  local_68.y = L'\x01';
  local_78 = 0;
  lVar49.x = L'\0';
  wVar25 = L'\0';
  local_70 = (ulong)uVar29;
  do {
    wVar47 = pcVar16->height;
    local_f8 = lVar49.x;
    local_f4 = wVar25;
    local_f0 = uVar15;
    local_e0 = uVar39;
    if (wVar47 < L'\x03') {
      uVar15 = (ulong)(uint)(wVar47 + L'\xffffffff');
    }
    else {
      lVar46 = 1;
      lVar49 = local_68;
      do {
        if (L'\x02' < pcVar16->width) {
          lVar51 = 1;
          lVar37 = lVar49;
          do {
            square_set_feat((chunk_conflict *)pcVar16,lVar37,FEAT_GRANITE);
            lVar51 = lVar51 + 1;
            lVar37 = (loc)((long)lVar37 + 1);
          } while (lVar51 < (long)pcVar16->width + -1);
        }
        lVar46 = lVar46 + 1;
        wVar47 = pcVar16->height;
        uVar15 = (long)wVar47 - 1;
        lVar49 = (loc)((long)lVar49 + 0x100000000);
      } while (lVar46 < (long)uVar15);
    }
    iVar48 = strcmp(world->name,"Angband Dungeon");
    if (iVar48 == 0) {
      iVar48 = local_88;
      if (-6 < (int)local_70) {
        do {
          build_streamer(pcVar16,FEAT_LAVA,L'\0');
          iVar48 = iVar48 + -1;
        } while (iVar48 != 0);
      }
      uVar54 = 0;
      generate_starburst_room
                (pcVar16,L'\x01',L'\x01',pcVar16->height + L'\xffffffff',
                 pcVar16->width + L'\xffffffff',false,FEAT_FLOOR,false);
    }
    else {
      lVar49.x = pcVar16->width;
      uVar54 = 0;
      fill_ellipse(pcVar16,(int)(((uint)(uVar15 >> 0x1f) & 1) + (int)uVar15) >> 1,
                   (lVar49.x - (lVar49.x + L'\xffffffff' >> 0x1f)) + -1 >> 1,
                   (wVar47 - (wVar47 + L'\xfffffffc' >> 0x1f)) + -4 >> 1,
                   (lVar49.x - (lVar49.x + L'\xfffffffa' >> 0x1f)) + -6 >> 1,FEAT_FLOOR,L'\0',false)
      ;
    }
    if (L'\x02' < pcVar16->height) {
      lVar45.x = L'\x01';
      lVar45.y = L'\x01';
      lVar46 = 1;
      do {
        if (L'\x02' < pcVar16->width) {
          lVar51 = 1;
          lVar49 = lVar45;
          do {
            psVar19 = square((chunk_conflict *)pcVar16,lVar49);
            flag_off(psVar19->info,3,4);
            _Var7 = square_isperm((chunk_conflict *)pcVar16,lVar49);
            if (((!_Var7) && (_Var7 = square_isfiery((chunk_conflict *)pcVar16,lVar49), !_Var7)) &&
               (_Var7 = square_isfloor((chunk_conflict *)pcVar16,lVar49), !_Var7)) {
              square_set_feat((chunk_conflict *)pcVar16,lVar49,FEAT_PERM);
            }
            lVar51 = lVar51 + 1;
            lVar49 = (loc)((long)lVar49 + 1);
          } while (lVar51 < (long)pcVar16->width + -1);
        }
        lVar46 = lVar46 + 1;
        lVar45 = (loc)((long)lVar45 + 0x100000000);
      } while (lVar46 < (long)pcVar16->height + -1);
    }
    lVar49.x = pcVar16->width;
    wVar25 = lVar49.x + L'\x03';
    if (L'\xffffffff' < lVar49.x) {
      wVar25 = lVar49.x;
    }
    uVar29 = Rand_div(lVar49.x / 2);
    local_60 = CONCAT44(extraout_var_00,uVar29);
    lVar26.x = (wVar25 >> 2) + uVar29;
    lVar26.y = L'\0';
    lVar49.x = pcVar16->height;
    wVar47 = lVar49.x + L'\x03';
    if (L'\xffffffff' < lVar49.x) {
      wVar47 = lVar49.x;
    }
    uVar43 = wVar47 >> 2;
    local_58 = (ulong)(uint)(wVar25 >> 2);
    uVar29 = Rand_div(lVar49.x / 2);
    local_50 = CONCAT44(extraout_var_01,uVar29);
    uVar23 = uVar43 + uVar29;
    local_c0 = (ulong)uVar23;
    local_b8 = (long)(int)lVar26.x;
    iVar48 = (int)((ulong)(local_b8 * -0x2aaaaaab) >> 0x20);
    local_d0 = (ulong)(uint)(iVar48 - (iVar48 >> 0x1f));
    local_108.y = L'\0';
    local_108.x = (pcVar16->width - lVar26.x) / 6;
    uVar32 = uVar43 + uVar29 + 3;
    if (-1 < (int)uVar23) {
      uVar32 = uVar23;
    }
    local_d8.x = -((int)uVar32 >> 2);
    iVar30 = pcVar16->height - uVar23;
    iVar48 = iVar30 + 3;
    if (-1 < iVar30) {
      iVar48 = iVar30;
    }
    local_100.x = iVar48 >> 2;
    local_48 = local_c0 << 0x20;
    local_a8.y = uVar23;
    local_a8.x = lVar26.x;
    iVar48 = 0;
    local_130 = local_38;
    uVar15 = local_f0;
    uVar39 = local_e0;
    wVar25 = local_f4;
    lVar49.x = local_f8;
    local_c8 = lVar26;
    local_40 = (ulong)uVar43;
    do {
      lVar20 = *(loc *)local_130;
      pcVar16 = c;
      local_130 = lVar20;
      if (lVar20 == (loc)0x0) break;
      bVar52 = 99 < iVar48;
      uVar27 = local_d0;
      if (iVar48 < 100) {
        do {
          while( true ) {
            iVar30 = iVar48;
            uVar29 = Rand_div(2);
            if (uVar29 == 0) {
              uVar29 = Rand_div(2);
              uVar23 = -(uint)(uVar29 == 0) | 1;
              uVar32 = rand_range(local_d8.x,local_100.x);
            }
            else {
              uVar23 = rand_range((int)uVar27,local_108.x);
              uVar29 = Rand_div(2);
              uVar32 = -(uint)(uVar29 == 0) | 1;
            }
            uVar39 = (ulong)uVar23;
            uVar15 = (ulong)uVar32;
            if ((uVar32 == 0) || (uVar23 == 0)) break;
            lot.y = uVar32;
            lot.x = uVar23;
            local_f0 = uVar15;
            get_lot_bounds(c,local_a8,lot,(wchar_t)&local_140,(int)&local_140 + L'\x04',&local_118.x
                           ,&local_118.y,(int *)CONCAT44(in_stack_fffffffffffffea4,uVar54),(int *)c)
            ;
            lVar20.x = local_118.x - local_140.x;
            lVar20.y = L'\0';
            if (lVar20.x < 5) {
              bVar52 = false;
            }
            else {
              local_138 = CONCAT44(local_138._4_4_,local_140.y);
              lVar20.x = local_118.y - local_140.y;
              lVar20.y = L'\0';
              if (lVar20.x < 3) {
                bVar52 = false;
              }
              else {
                bVar52 = true;
                if (local_140.x <= local_118.x) {
                  wVar9 = local_118.y + L'\x01';
                  local_128 = CONCAT44(local_128._4_4_,local_118.x);
                  wVar47 = local_140.x;
                  local_120 = (ulong)(uint)local_118.y;
                  local_e0 = uVar39;
                  do {
                    wVar31 = (wchar_t)local_138;
                    if ((wchar_t)local_138 <= (wchar_t)local_120) {
                      do {
                        grid_00.y = wVar31;
                        grid_00.x = wVar47;
                        lVar20.x._0_1_ = square_isfloor((chunk_conflict *)c,grid_00);
                        lVar20._1_7_ = extraout_var;
                        if (!lVar20.x._0_1_) {
                          bVar52 = false;
                          uVar27 = local_d0;
                          uVar39 = local_e0;
                          goto LAB_0014ae23;
                        }
                        wVar31 = wVar31 + L'\x01';
                      } while (wVar9 != wVar31);
                    }
                    lVar20.y = L'\0';
                    lVar20.x = wVar47 + L'\x01';
                    bVar53 = wVar47 != (wchar_t)local_128;
                    uVar27 = local_d0;
                    uVar39 = local_e0;
                    wVar47 = wVar47 + L'\x01';
                  } while (bVar53);
                }
              }
            }
LAB_0014ae23:
            uVar15 = local_f0;
            if ((bVar52) || (iVar48 = iVar30 + 1, 0x62 < iVar30)) goto LAB_0014ae3e;
          }
          lVar20.x = L'\0';
          lVar20.y = L'\0';
          iVar48 = iVar30 + 1;
        } while (iVar30 < 99);
LAB_0014ae3e:
        bVar52 = 0x62 < iVar30;
        iVar48 = iVar30 + 1;
      }
      if (!bVar52) {
        iVar30 = (int)uVar15;
        local_f8 = (int)local_c0 + iVar30 * 4;
        wVar47 = (wchar_t)local_a0;
        local_a0 = local_a0 & 0xffffffff;
        if (local_f8 <= wVar47) {
          local_a0 = (ulong)(uint)local_f8;
        }
        if (local_f8 < lVar49.x) {
          local_f8 = lVar49.x;
        }
        iVar11 = (int)uVar39;
        local_f4 = (int)local_b8 + iVar11 * 6;
        lVar49.x = (wchar_t)local_98;
        local_98 = local_98 & 0xffffffff;
        if (local_f4 <= lVar49.x) {
          local_98 = (ulong)(uint)local_f4;
        }
        if (local_f4 < wVar25) {
          local_f4 = wVar25;
        }
        get_lot_bounds(c,local_a8,(loc_conflict)(uVar39 & 0xffffffff | uVar15 << 0x20),
                       (wchar_t)&local_140,(wchar_t)&local_118,&local_10c,&local_110,
                       (int *)CONCAT44(in_stack_fffffffffffffea4,uVar54),(int *)c);
        wVar25 = local_10c;
        lVar49.x = local_110;
        iVar12 = local_118.x;
        local_150.x = local_140.x;
        local_f0 = uVar15;
        local_e0 = uVar39;
        if (iVar11 - 2U < 0xfffffffd) {
          if (iVar30 == -1) {
            uVar32 = local_118.x + L'\x01';
            uVar29 = Rand_div(2);
            if ((int)uVar32 < lVar49.x - uVar29) {
              uVar29 = Rand_div(2);
              uVar32 = lVar49.x - uVar29;
            }
            local_148 = (loc)(ulong)uVar32;
            local_128 = (ulong)(uVar32 - 2);
            local_120 = (ulong)local_148;
          }
          else {
            uVar32 = local_110 + L'\xffffffff';
            uVar29 = Rand_div(2);
            if ((int)(uVar29 + iVar12) < (int)uVar32) {
              uVar29 = Rand_div(2);
              uVar32 = uVar29 + iVar12;
            }
            local_148 = (loc)(ulong)uVar32;
            local_120 = (ulong)(uVar32 + 2);
            local_128 = (ulong)local_148;
          }
          wVar25 = local_10c;
          iVar30 = local_140.x;
          wVar47 = rand_range(local_140.x + L'\x01',local_10c + L'\xfffffffe');
          lVar49.x = wVar47 + L'\xfffffffe';
          if (wVar47 + L'\xfffffffe' < iVar30) {
            lVar49.x = iVar30;
          }
          wVar9 = rand_range(lVar49.x,wVar47);
          lVar49 = (loc)loc(wVar9 + L'\xffffffff',local_148.x);
          _Var7 = square_isfloor((chunk_conflict *)c,lVar49);
          local_150.x = wVar9 + L'\x01';
          lVar49.x = local_150.x;
          if (local_150.x < wVar47) {
            lVar49.x = wVar47;
          }
          if (_Var7) {
            lVar49.x = wVar47;
            local_150.x = wVar9;
          }
          uVar27 = (ulong)(uint)lVar49.x;
          if (lVar49.x + L'\x02' < wVar25) {
            wVar25 = lVar49.x + L'\x02';
          }
          wVar25 = rand_range(local_150.x + L'\x02',wVar25);
          uVar39 = local_128;
          uVar15 = local_120;
          if (1 < wVar25 - local_150.x) {
            lVar37 = (loc)loc(wVar25 + L'\x01',local_148.x);
            bVar53 = square_isfloor((chunk_conflict *)c,lVar37);
            uVar39 = local_128;
            uVar15 = local_120;
joined_r0x0014b542:
            local_128 = uVar39;
            local_120 = uVar15;
            if (!bVar53) {
              wVar25 = wVar25 + L'\xffffffff';
              uVar27 = (ulong)(uint)lVar49.x;
              if (wVar25 <= lVar49.x) {
                uVar27 = (ulong)(uint)wVar25;
              }
            }
          }
        }
        else if (iVar30 - 2U < 0xfffffffd) {
          if (iVar11 == -1) {
            uVar32 = local_140.x + L'\x01';
            uVar29 = Rand_div(2);
            uVar8 = Rand_div(2);
            if ((int)uVar32 < wVar25 - (uVar8 + uVar29)) {
              uVar29 = Rand_div(2);
              uVar8 = Rand_div(2);
              uVar32 = wVar25 - (uVar8 + uVar29);
            }
            local_138 = (ulong)uVar32;
            local_150.x = uVar32 + L'\xfffffffe';
            local_e8 = local_138;
          }
          else {
            lVar49.x = local_10c + L'\xffffffff';
            uVar29 = Rand_div(2);
            uVar8 = Rand_div(2);
            if (uVar8 + uVar29 + local_150.x < lVar49.x) {
              uVar29 = Rand_div(2);
              uVar8 = Rand_div(2);
              lVar49.x = uVar8 + uVar29 + local_150.x;
            }
            local_e8 = (ulong)(uint)lVar49.x;
            local_138 = (ulong)(uint)(lVar49.x + L'\x02');
            local_150.x = lVar49.x;
          }
          wVar25 = local_110;
          iVar30 = local_118.x;
          uVar32 = rand_range(local_118.x,local_110 + L'\xffffffff');
          lVar49.x = uVar32 + L'\xfffffffe';
          if (uVar32 + L'\xfffffffe' < iVar30) {
            lVar49.x = iVar30;
          }
          uVar10 = rand_range(lVar49.x,uVar32);
          lVar49 = (loc)loc((int)local_e8,uVar10 - 1);
          _Var7 = square_isfloor((chunk_conflict *)c,lVar49);
          uVar23 = uVar10 + 1;
          uVar43 = uVar23;
          if ((int)uVar23 < (int)uVar32) {
            uVar43 = uVar32;
          }
          if (_Var7) {
            uVar23 = uVar10;
          }
          if (_Var7) {
            uVar43 = uVar32;
          }
          local_148 = (loc)(ulong)uVar43;
          uVar32 = uVar23 + 1;
          if ((int)(uVar23 + 1) <= (int)uVar43) {
            uVar32 = uVar43;
          }
          lVar49.x = uVar43 + L'\x02';
          if (wVar25 < uVar43 + L'\x02') {
            lVar49.x = wVar25;
          }
          uVar32 = rand_range(uVar32,lVar49.x);
          uVar27 = local_e8;
          uVar15 = (ulong)uVar32;
          uVar39 = (ulong)uVar23;
          if ((int)(uVar32 - uVar23) < 2) {
            wVar25 = (wchar_t)local_138;
          }
          else {
            lVar49 = (loc)loc((int)local_e8,uVar32 + 1);
            _Var7 = square_isfloor((chunk_conflict *)c,lVar49);
            if ((!_Var7) && (uVar15 = (ulong)(uVar32 - 1), (int)(uVar32 - 1) <= (int)uVar43)) {
              local_148 = (loc)uVar15;
            }
            wVar25 = (wchar_t)local_138;
          }
        }
        else {
          if (iVar11 < 0) {
            local_138 = (ulong)(uint)local_10c;
            uVar29 = Rand_div(2);
            lVar49.x = ~uVar29 + (wchar_t)local_138;
            uVar29 = Rand_div(2);
            if (uVar29 + lVar49.x < (int)local_138) {
              uVar29 = Rand_div(2);
              local_138 = (ulong)(uint)(uVar29 + lVar49.x);
            }
            wVar25 = lVar49.x + L'\xfffffffe';
            if (lVar49.x + L'\xfffffffe' < local_140.x) {
              wVar25 = local_140.x;
            }
            local_150.x = rand_range(wVar25,(int)local_138 + -2);
          }
          else {
            uVar29 = Rand_div(2);
            iVar30 = local_150.x + uVar29;
            lVar49.x = iVar30 + L'\x01';
            uVar29 = Rand_div(2);
            if (local_150.x < lVar49.x - uVar29) {
              uVar29 = Rand_div(2);
              local_150.x = lVar49.x - uVar29;
            }
            wVar25 = iVar30 + L'\x03';
            if (local_10c < wVar25) {
              wVar25 = local_10c;
            }
            uVar32 = rand_range(local_150.x + L'\x02',wVar25);
            local_138 = (ulong)uVar32;
          }
          wVar25 = local_110;
          iVar30 = local_118.x;
          local_e8 = (ulong)(uint)lVar49.x;
          bVar53 = (wchar_t)local_138 == lVar49.x;
          if ((long)(uVar15 << 0x20) < 0) {
            uVar29 = Rand_div(2);
            uVar23 = wVar25 - uVar29;
            local_148 = (loc)(ulong)uVar23;
            uVar32 = uVar23;
            if (local_150.x == lVar49.x || bVar53) {
              uVar29 = Rand_div(2);
              uVar32 = uVar29 + uVar23;
            }
            uVar27 = local_e8;
            uVar15 = (ulong)uVar32;
            lVar49.x = uVar23 + L'\xfffffffe';
            if (uVar23 + L'\xfffffffe' < local_118.x) {
              lVar49.x = local_118.x;
            }
            uVar39 = (ulong)(uint)lVar49.x;
            if (1 < uVar32 - lVar49.x) {
              local_120 = uVar15;
              lVar37 = (loc)loc((int)local_e8,lVar49.x + L'\xffffffff');
              _Var7 = square_isfloor((chunk_conflict *)c,lVar37);
              uVar15 = local_120;
              if (!_Var7) {
                uVar32 = lVar49.x + L'\x01';
                uVar39 = (ulong)uVar32;
                if ((int)uVar23 < (int)uVar32) {
                  local_148 = (loc)(ulong)uVar32;
                }
              }
            }
          }
          else {
            uVar29 = Rand_div(2);
            uVar23 = uVar29 + iVar30;
            local_148 = (loc)(ulong)uVar23;
            uVar32 = uVar23;
            if (local_150.x == lVar49.x || bVar53) {
              uVar29 = Rand_div(2);
              uVar32 = uVar23 - uVar29;
            }
            uVar27 = local_e8;
            lVar49.x = uVar23 + L'\x02';
            if (local_110 < uVar23 + L'\x02') {
              lVar49.x = local_110;
            }
            uVar15 = (ulong)(uint)lVar49.x;
            uVar39 = (ulong)uVar32;
            if (1 < lVar49.x - uVar32) {
              local_128 = (ulong)uVar32;
              lVar37 = (loc)loc((int)local_e8,lVar49.x + L'\x01');
              _Var7 = square_isfloor((chunk_conflict *)c,lVar37);
              uVar39 = local_128;
              if (!_Var7) {
                uVar32 = lVar49.x + L'\xffffffff';
                uVar15 = (ulong)uVar32;
                if ((int)uVar32 < (int)uVar23) {
                  local_148 = (loc)(ulong)uVar32;
                }
              }
            }
          }
          lVar49.x = (wchar_t)uVar27;
          iVar30 = (int)local_138 - local_150.x;
          if ((iVar11 < 0) && (1 < iVar30)) {
            local_128 = uVar39;
            local_120 = uVar15;
            lVar37 = (loc)loc(local_150.x + L'\xffffffff',SUB84(local_148,0));
            _Var7 = square_isfloor((chunk_conflict *)c,lVar37);
            wVar25 = (wchar_t)local_138;
            uVar39 = local_128;
            uVar15 = local_120;
            if (!_Var7) {
              local_150.x = local_150.x + L'\x01';
              uVar27 = uVar27 & 0xffffffff;
              if (lVar49.x <= local_150.x) {
                uVar27 = (ulong)(uint)local_150.x;
              }
              goto LAB_0014b55f;
            }
          }
          wVar25 = (wchar_t)local_138;
          if ((0 < iVar11) && (1 < iVar30)) {
            local_128 = uVar39;
            local_120 = uVar15;
            lVar37 = (loc)loc(wVar25 + L'\x01',SUB84(local_148,0));
            bVar53 = square_isfloor((chunk_conflict *)c,lVar37);
            uVar39 = local_128;
            uVar15 = local_120;
            goto joined_r0x0014b542;
          }
        }
LAB_0014b55f:
        lVar49.x = local_140.x;
        if (local_140.x < local_150.x) {
          lVar49.x = local_150.x;
        }
        wVar47 = local_10c;
        if (wVar25 < local_10c) {
          wVar47 = wVar25;
        }
        wVar25 = local_118.x;
        if (local_118.x < (wchar_t)uVar39) {
          wVar25 = (wchar_t)uVar39;
        }
        wVar9 = local_110;
        if ((wchar_t)uVar15 < local_110) {
          wVar9 = (wchar_t)uVar15;
        }
        fill_rectangle(c,wVar25,lVar49.x,wVar9,wVar47,FEAT_PERM,L'\0');
        lVar20 = (loc)z_info;
        uVar15 = local_f0;
        uVar39 = local_e0;
        wVar25 = local_f4;
        lVar49.x = local_f8;
        if (z_info->f_max != 0) {
          lVar46 = 0x29;
          lVar50.x = L'\0';
          lVar50.y = L'\0';
          do {
            _Var7 = feat_is_shop(lVar50.x);
            if ((_Var7) &&
               (*(uint *)((long)local_130 + 0x18) + 1 == (uint)f_info->flags[lVar46 + -0x2b])) {
              square_set_feat((chunk_conflict *)c,
                              (loc)(uVar27 & 0xffffffff | (long)local_148 << 0x20),lVar50.x);
            }
            lVar50 = (loc)((long)lVar50 + 1);
            lVar20._2_6_ = 0;
            lVar20.x._0_2_ = z_info->f_max;
            lVar46 = lVar46 + 0x78;
            uVar15 = local_f0;
            uVar39 = local_e0;
            wVar25 = local_f4;
            lVar49.x = local_f8;
          } while ((ulong)lVar50 < (ulong)lVar20);
        }
      }
      pcVar16 = c;
    } while (!bVar52);
    c = pcVar16;
    if (iVar48 < 100) {
      local_78 = CONCAT71(lVar20._1_7_,1);
      uVar27 = local_d0;
      uVar6 = uVar39;
      if ((wchar_t)local_d0 <= local_108.x) {
        do {
          local_e0 = uVar6;
          local_f0 = uVar15;
          local_f4 = wVar25;
          local_f8 = lVar49.x;
          if ((int)uVar27 != 0) {
            lVar49.x = local_d8.x;
            uVar15 = uVar27;
            if (local_d8.x <= local_100.x) {
              do {
                local_d0 = uVar15;
                if (((lVar49.x != L'\0') && (uVar29 = Rand_div(100), (int)uVar29 < 0x51)) &&
                   (uVar29 = Rand_div(2), uVar29 == 0)) {
                  local_120 = (ulong)(uint)lVar49.x;
                  lVar28 = loc((int)uVar27,lVar49.x);
                  get_lot_bounds(pcVar16,local_a8,lVar28,(wchar_t)&local_140,
                                 (int)&local_140 + L'\x04',&local_118.x,&local_118.y,
                                 (int *)CONCAT44(in_stack_fffffffffffffea4,uVar54),(int *)c);
                  iVar30 = local_118.y;
                  iVar48 = local_140.y;
                  local_130.x = local_118.x;
                  bVar52 = local_140.x <= local_118.x;
                  pcVar16 = c;
                  if (local_140.x <= local_118.x) {
                    wVar25 = local_118.y + L'\x01';
                    bVar52 = true;
                    lVar49.x = local_140.x;
                    do {
                      wVar47 = iVar48;
                      if (iVar48 <= iVar30) {
                        do {
                          grid_01.y = wVar47;
                          grid_01.x = lVar49.x;
                          psVar19 = square((chunk_conflict *)pcVar16,grid_01);
                          _Var7 = feat_is_shop((uint)psVar19->feat);
                          if (_Var7) goto LAB_0014b791;
                          wVar47 = wVar47 + L'\x01';
                        } while (wVar25 != wVar47);
                      }
                      bVar53 = lVar49.x != local_130.x;
                      bVar52 = lVar49.x < local_130.x;
                      lVar49.x = lVar49.x + L'\x01';
                    } while (bVar53);
                  }
LAB_0014b791:
                  lVar49.x = (wchar_t)local_120;
                  uVar27 = local_d0;
                  uVar39 = local_e0;
                  c = pcVar16;
                  if (!bVar52) {
                    pcVar55 = pcVar16;
                    lVar28 = loc((int)local_d0,lVar49.x);
                    get_lot_bounds(pcVar16,local_a8,lVar28,(wchar_t)&local_140,(wchar_t)&local_118,
                                   &local_10c,&local_110,
                                   (int *)CONCAT44(in_stack_fffffffffffffea4,uVar54),(int *)pcVar55)
                    ;
                    lVar49.x = local_10c;
                    iVar48 = local_118.x;
                    local_b8 = CONCAT44(local_b8._4_4_,local_140.x);
                    pcVar16 = pcVar55;
                    if ((local_140.x < local_10c) &&
                       (local_128 = (ulong)(uint)local_110, local_118.x < local_110)) {
                      iVar30 = rand_range(1,4);
                      iVar11 = rand_range(1,2);
                      iVar12 = rand_range(1,5 - iVar30);
                      iVar13 = rand_range(1,3 - iVar11);
                      wVar47 = iVar13 + iVar11 + (wchar_t)local_128 + L'\xfffffffc';
                      wVar25 = (wchar_t)local_b8;
                      local_80 = iVar12 + (wchar_t)local_b8;
                      local_84 = iVar12 + iVar30 + lVar49.x + L'\xfffffffa';
                      fill_rectangle(pcVar55,iVar13 + iVar48,local_80,wVar47,local_84,FEAT_GRANITE,
                                     L'\0');
                      pcVar16 = pcVar55;
                      if (wVar25 <= lVar49.x) {
                        iVar30 = (int)local_128;
                        wVar25 = (wchar_t)local_b8;
                        do {
                          if (iVar48 <= (wchar_t)local_128) {
                            local_130.x._0_1_ = local_84 < wVar25 || wVar25 < local_80;
                            local_138 = CONCAT71(local_138._1_7_,
                                                 wVar25 == L'\x02' || (wchar_t)local_b8 < wVar25);
                            local_e8 = CONCAT44(local_e8._4_4_,wVar25 + L'\xffffffff');
                            local_7c = wVar25 + L'\x01';
                            wVar9 = iVar48;
                            do {
                              if ((wVar47 < wVar9) ||
                                 (wVar9 < iVar13 + iVar48 || (char)local_130.x != '\0')) {
                                uVar29 = Rand_div(3);
                                if (uVar29 == 0) {
                                  lVar37 = (loc)loc(wVar25,wVar9);
                                  _Var7 = square_isfloor((chunk_conflict *)pcVar16,lVar37);
                                  if (_Var7) {
                                    if ((char)local_138 == '\0') {
                                      lVar37 = (loc)loc((int)local_e8,wVar9);
                                      _Var7 = square_isperm((chunk_conflict *)pcVar16,lVar37);
                                      if (_Var7) goto LAB_0014baa3;
                                    }
                                    if ((lVar49.x <= wVar25) &&
                                       (wVar25 != pcVar16->width + L'\xfffffffe')) {
                                      lVar37 = (loc)loc(local_7c,wVar9);
                                      _Var7 = square_isperm((chunk_conflict *)pcVar16,lVar37);
                                      if (_Var7) goto LAB_0014baa3;
                                    }
                                    if (wVar9 != L'\x02' && wVar9 <= iVar48) {
                                      lVar37 = (loc)loc(wVar25,wVar9 + L'\xffffffff');
                                      _Var7 = square_isperm((chunk_conflict *)pcVar16,lVar37);
                                      if (_Var7) goto LAB_0014baa3;
                                    }
                                    pwVar18 = &FEAT_PASS_RUBBLE;
                                    if (((wchar_t)local_128 <= wVar9) &&
                                       (pwVar18 = &FEAT_PASS_RUBBLE,
                                       wVar9 != pcVar16->height + L'\xfffffffe')) {
                                      lVar37 = (loc)loc(wVar25,wVar9 + L'\x01');
                                      _Var7 = square_isperm((chunk_conflict *)pcVar16,lVar37);
                                      pwVar18 = &FEAT_PASS_RUBBLE;
                                      if (_Var7) goto LAB_0014baa3;
                                    }
LAB_0014b974:
                                    lVar37 = (loc)loc(wVar25,wVar9);
                                    square_set_feat((chunk_conflict *)pcVar16,lVar37,*pwVar18);
                                  }
                                }
                              }
                              else {
                                uVar29 = Rand_div(4);
                                pwVar18 = &FEAT_RUBBLE;
                                if (uVar29 == 0) goto LAB_0014b974;
                              }
LAB_0014baa3:
                              wVar9 = wVar9 + L'\x01';
                            } while (iVar30 + L'\x01' != wVar9);
                          }
                          bVar52 = wVar25 != lVar49.x;
                          wVar25 = wVar25 + L'\x01';
                        } while (bVar52);
                      }
                    }
                    lVar49.x = (wchar_t)local_120;
                    uVar27 = local_d0;
                    uVar39 = local_e0;
                    c = pcVar16;
                  }
                }
                bVar52 = lVar49.x != local_100.x;
                lVar49.x = lVar49.x + L'\x01';
                uVar15 = local_d0;
              } while (bVar52);
            }
          }
          wVar47 = (wchar_t)uVar27;
          uVar27 = (ulong)(uint)(wVar47 + L'\x01');
          uVar15 = local_f0;
          lVar49.x = local_f8;
          wVar25 = local_f4;
          uVar6 = local_e0;
        } while (wVar47 != local_108.x);
      }
    }
  } while ((local_78 & 1) == 0);
  fill_rectangle(pcVar16,(wchar_t)local_a0,local_c8.x,lVar49.x,local_c8.x + L'\x01',FEAT_FLOOR,L'\0'
                );
  fill_rectangle(pcVar16,(wchar_t)local_c0,(wchar_t)local_98,(wchar_t)local_c0 + L'\x01',wVar25,
                 FEAT_FLOOR,L'\0');
  lVar21 = (loc)loc(0,0);
  local_130 = (loc)loc(0,0);
  plVar4 = world;
  uVar15 = (ulong)local_130 >> 0x20;
  pcVar14 = strstr(world->name,"Wilderness");
  if (pcVar14 == (char *)0x0) {
    do {
      lVar49.x = pcVar16->width;
      pcVar16 = c;
      uVar29 = Rand_div((((uint)(lVar49.x / 6 + (lVar49.x >> 0x1f)) >> 1) - (lVar49.x >> 0x1f)) * 2
                        + 1);
      iVar48 = (int)((ulong)((long)pcVar16->width * -0x2aaaaaab) >> 0x20);
      lVar49.x = ((iVar48 >> 1) - (iVar48 >> 0x1f)) + lVar49.x / 2 + uVar29;
      lVar49.y = L'\0';
      c = pcVar16;
      _Var7 = square_isfloor((chunk_conflict *)pcVar16,lVar49);
      lVar37 = lVar49;
      if ((_Var7) || (pcVar16->height < L'\x02')) {
        uVar39 = 0;
      }
      else {
        lVar46 = 0;
        do {
          lVar51 = lVar46;
          lVar37 = (loc)((long)lVar37 + 0x100000000);
          _Var7 = square_isfloor((chunk_conflict *)pcVar16,lVar37);
          if (_Var7) break;
          lVar46 = lVar51 + 1;
        } while (lVar46 < pcVar16->height / 2);
        uVar39 = (ulong)((int)lVar51 + 1);
      }
    } while (pcVar16->height / 2 <= (int)uVar39);
    square_set_feat((chunk_conflict *)pcVar16,lVar37,FEAT_MORE);
LAB_0014bf5a:
    wVar25 = local_130.x;
  }
  else {
    plVar35 = plVar4->levels;
    sVar2 = local_b0->place;
    sVar3 = local_b0->last_place;
    if (plVar35[sVar2].north == (char *)0x0) {
      local_d8.x = L'\0';
      local_d8.y = L'\0';
    }
    else {
      local_d8 = (loc)level_by_name(plVar4,plVar35[sVar2].north);
    }
    if (plVar35[sVar2].east == (char *)0x0) {
      local_150.x = L'\0';
      local_150.y = L'\0';
    }
    else {
      local_150 = (loc)level_by_name(world,plVar35[sVar2].east);
    }
    if (plVar35[sVar2].south == (char *)0x0) {
      local_108.x = L'\0';
      local_108.y = L'\0';
    }
    else {
      local_108 = (loc)level_by_name(world,plVar35[sVar2].south);
    }
    pcVar16 = c;
    if (plVar35[sVar2].west == (char *)0x0) {
      local_148.x = L'\0';
      local_148.y = L'\0';
    }
    else {
      local_148 = (loc)level_by_name(world,plVar35[sVar2].west);
    }
    local_100 = (loc)(plVar35 + sVar3);
    if (local_d8 == (loc)0x0) {
      lVar49.x = lVar21.y;
    }
    else {
      grid_02.x = (int)local_58 + (int)local_60;
      grid_02.y = L'\0';
      uVar39 = 0;
      do {
        grid_02 = (loc)((long)grid_02 + 0x100000000);
        _Var7 = square_isfloor((chunk_conflict *)c,grid_02);
        lVar49.x = (int)uVar39 + L'\x01';
        uVar39 = (ulong)(uint)lVar49.x;
      } while (!_Var7);
      square_set_feat((chunk_conflict *)c,grid_02,FEAT_MORE_NORTH);
      if (local_d8 == local_100) {
        local_130 = local_c8;
        uVar15 = uVar39;
      }
      local_130 = (loc)((ulong)local_130 & 0xffffffff);
      lVar21 = local_c8;
    }
    uVar39 = local_48;
    if (local_150 != (loc)0x0) {
      lVar21.y = L'\0';
      lVar21.x = c->width;
      do {
        lVar21.x = lVar21.x + L'\xffffffff';
        lVar21.y = L'\0';
        _Var7 = square_isfloor((chunk_conflict *)c,(loc)(uVar39 | (ulong)lVar21));
      } while (!_Var7);
      square_set_feat((chunk_conflict *)c,(loc)(uVar39 | (ulong)lVar21),FEAT_MORE_EAST);
      if (local_150 == local_100) {
        uVar15 = local_c0;
      }
      uVar15 = uVar15 & 0xffffffff;
      local_130 = (loc)((ulong)local_130 & 0xffffffff);
      if (local_150 == local_100) {
        local_130 = lVar21;
      }
      lVar49.x = (wchar_t)local_c0;
    }
    lVar37 = local_c8;
    c = pcVar16;
    if (local_108 != (loc)0x0) {
      uVar39 = (ulong)(uint)pcVar16->height;
      do {
        lVar49.x = (int)uVar39 + L'\xffffffff';
        uVar39 = (ulong)(uint)lVar49.x;
        lVar34 = (loc)(uVar39 << 0x20 | (ulong)lVar37);
        _Var7 = square_isfloor((chunk_conflict *)pcVar16,lVar34);
      } while (!_Var7);
      square_set_feat((chunk_conflict *)pcVar16,lVar34,FEAT_MORE_SOUTH);
      if (local_108 == local_100) {
        local_130 = lVar37;
        uVar15 = uVar39;
      }
      local_130 = (loc)((ulong)local_130 & 0xffffffff);
      lVar21 = local_c8;
    }
    local_c8 = lVar21;
    uVar39 = local_c0;
    if (local_148 == (loc)0x0) {
      uVar39 = (ulong)(uint)lVar49.x;
      lVar49.x = local_c8.x;
      goto LAB_0014bf5a;
    }
    lVar49 = (loc)((ulong)(uint)((int)local_40 + (int)local_50) << 0x20);
    do {
      lVar49 = (loc)((long)lVar49 + 1);
      _Var7 = square_isfloor((chunk_conflict *)pcVar16,lVar49);
    } while (!_Var7);
    square_set_feat((chunk_conflict *)pcVar16,lVar49,FEAT_MORE_WEST);
    if (local_148 == local_100) {
      uVar15 = uVar39;
    }
    uVar15 = uVar15 & 0xffffffff;
    lVar37 = local_130;
    if (local_148 == local_100) {
      lVar37 = lVar49;
    }
    wVar25 = lVar37.x;
  }
  if (((wVar25 == L'\0') || ((int)uVar15 == 0)) &&
     ((lVar49.x == L'\0' || (uVar15 = uVar39 & 0xffffffff, wVar25 = lVar49.x, (int)uVar39 == 0)))) {
    __assert_fail("grid.x && grid.y",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                  ,0x9f9,"struct loc place_town_stairs(struct chunk *, struct player *, struct loc)"
                 );
  }
  iVar30 = (int)uVar15 + -1;
  iVar48 = iVar30;
  lVar49.x = wVar25 + L'\xffffffff';
  do {
    lVar37 = (loc)loc(lVar49.x,iVar48);
    _Var7 = square_isfiery((chunk_conflict *)c,lVar37);
    if (_Var7) {
      lVar37 = (loc)loc(lVar49.x,iVar48);
      square_set_feat((chunk_conflict *)c,lVar37,FEAT_GRANITE);
    }
    bVar52 = iVar48 <= (int)uVar15;
    iVar48 = iVar48 + 1;
  } while ((bVar52) ||
          (bVar52 = lVar49.x <= wVar25, iVar48 = iVar30, lVar49.x = lVar49.x + L'\x01', bVar52));
  lVar28 = (loc_conflict)(uVar15 << 0x20 | (ulong)(uint)wVar25);
LAB_0014c0b0:
  ppVar5 = local_b0;
  player_place((chunk_conflict2 *)c,local_b0,lVar28);
  _Var7 = is_daytime();
  cave_illuminate(c,_Var7);
  for (uVar32 = local_8c; uVar32 != 0; uVar32 = uVar32 - 1) {
    to_avoid.x = (ppVar5->grid).x;
    to_avoid.y = (ppVar5->grid).y;
    pick_and_place_distant_monster(c,to_avoid,L'\x03',true,c->depth);
  }
  return c;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct level *lev = &world->levels[p->place];
	char *name = level_name(lev);
	struct chunk *c_new, *c_old = chunk_find_name(name);
	struct town *town = NULL;

	/* Find the town */
	for (i = 0; i < world->num_towns; i++) {
		town = &world->towns[i];
		if (town->index == p->place) break;
	}
	assert (i < world->num_towns);

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, town->num_stores > 4 ?
					 z_info->town_wid : z_info->town_wid / 2);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;
		c_new->place = p->place;

		/* Build stuff */
		town_gen_layout(c_new, p, town);
	} else {
		int feat = FEAT_MORE;

		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		c_new->place = p->place;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove(name);
		cave_free(c_old);

		/* Build a new house if needed */
		if (p->place == p->home) {
			struct loc door;
			if (!find_home(c_new, &door)) {
				build_new_house(c_new);
			}
		}

		/* Demolish an old house if needed */
		if (p->place != p->home) {
			struct loc door;
			if (find_home(c_new, &door)) {
				demolish_house(c_new, door);
			}
		}

		/* Get the correct path for wilderness */
		if (strstr(world->name, "Wilderness")) {
			struct level *last_lev = &world->levels[p->last_place];
			if (lev->north && streq(lev->north, level_name(last_lev))) {
				feat = FEAT_MORE_NORTH;
			} else if (lev->east && streq(lev->east, level_name(last_lev))) {
				feat = FEAT_MORE_EAST;
			} else if (lev->south && streq(lev->south, level_name(last_lev))) {
				feat = FEAT_MORE_SOUTH;
			} else if (lev->west && streq(lev->west, level_name(last_lev))) {
				feat = FEAT_MORE_WEST;
			}

			/* Deal with recall */
			if (feat == FEAT_MORE) {
				if (lev->north) {
				feat = FEAT_MORE_NORTH;
				} else if (lev->east) {
					feat = FEAT_MORE_EAST;
				} else if (lev->south) {
					feat = FEAT_MORE_SOUTH;
				} else if (lev->west) {
					feat = FEAT_MORE_WEST;
				}
			}
		}

		/* Find the required stair/path */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == feat) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}